

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::setFont(QPainter *this,QFont *font)

{
  long lVar1;
  bool bVar2;
  QPainterPrivate *pd;
  pointer pQVar3;
  QFont *in_RSI;
  QFont *in_RDI;
  long in_FS_OFFSET;
  QPainterPrivate *d;
  QFont *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int line;
  QFont *font_00;
  QFont *other;
  QFont *in_stack_ffffffffffffffb8;
  
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  other = in_RDI;
  pd = d_func((QPainter *)0x59897f);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x598995);
  if (bVar2) {
    font_00 = in_RSI;
    std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x5989dc);
    QFont::resolve(in_stack_ffffffffffffffb8,other);
    device((QPainter *)in_RDI);
    QFont::QFont(other,font_00,(QPaintDevice *)pd);
    std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
              ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x598a1c);
    QFont::operator=(in_RSI,in_stack_ffffffffffffff88);
    QFont::~QFont((QFont *)0x598a37);
    QFont::~QFont((QFont *)0x598a41);
    if (pd->extended == (QPaintEngineEx *)0x0) {
      pQVar3 = std::unique_ptr<QPainterState,_std::default_delete<QPainterState>_>::operator->
                         ((unique_ptr<QPainterState,_std::default_delete<QPainterState>_> *)0x598a5e
                         );
      QFlags<QPaintEngine::DirtyFlag>::operator|=
                (&(pQVar3->super_QPaintEngineState).dirtyFlags,DirtyFont);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)pd,(char *)in_RDI,line,(char *)in_stack_ffffffffffffff88);
    QMessageLogger::warning(&stack0xffffffffffffffb8,"QPainter::setFont: Painter not active");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::setFont(const QFont &font)
{
    Q_D(QPainter);

#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::setFont(), family=%s, pointSize=%d\n", font.families().first().toLatin1().constData(), font.pointSize());
#endif

    if (!d->engine) {
        qWarning("QPainter::setFont: Painter not active");
        return;
    }

    d->state->font = QFont(font.resolve(d->state->deviceFont), device());
    if (!d->extended)
        d->state->dirtyFlags |= QPaintEngine::DirtyFont;
}